

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestIpV4::testComparsion(TestIpV4 *this,string *param_1)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  test_root local_a00;
  test_root local_9e0;
  test_root local_9c0 [2];
  ostringstream ostr_3;
  exception *e_3;
  runtime_error *anon_var_0_3;
  string local_7f0 [32];
  IpV4 local_7d0 [6];
  byte local_7ca;
  byte local_7c9;
  string local_7c8 [6];
  bool caught_3;
  bool ok_3;
  string report_3;
  test_root local_7a8 [2];
  ostringstream ostr_2;
  exception *e_2;
  runtime_error *anon_var_0_2;
  string local_5d8 [32];
  IpV4 local_5b8 [6];
  byte local_5b2;
  byte local_5b1;
  string local_5b0 [6];
  bool caught_2;
  bool ok_2;
  string report_2;
  test_root local_590 [2];
  ostringstream ostr_1;
  exception *e_1;
  runtime_error *anon_var_0_1;
  string local_3c0 [32];
  IpV4 local_3a0 [6];
  byte local_39a;
  byte local_399;
  string local_398 [6];
  bool caught_1;
  bool ok_1;
  string report_1;
  test_root local_378 [2];
  ostringstream ostr;
  exception *e;
  runtime_error *anon_var_0;
  string local_1a8 [32];
  IpV4 local_188 [6];
  byte local_182;
  byte local_181;
  string local_180 [6];
  bool caught;
  bool ok;
  string report;
  test_root local_160;
  uint local_13c;
  test_root local_138;
  uint local_114;
  test_root local_110;
  uint local_ec;
  test_root local_e8;
  uint local_c8;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *param_5_local;
  TestIpV4 *this_local;
  
  local_18 = param_1;
  param_5_local = (string *)this;
  if ((testComparsion(std::__cxx11::string_const&)::testee == '\0') &&
     (iVar3 = __cxa_guard_acquire(&testComparsion(std::__cxx11::string_const&)::testee), iVar3 != 0)
     ) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"192.168.0.1",&local_39);
    IpV4::IpV4((IpV4 *)&testComparsion(std::__cxx11::string_const&)::testee,local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    __cxa_guard_release(&testComparsion(std::__cxx11::string_const&)::testee);
  }
  if ((testComparsion(std::__cxx11::string_const&)::localhost == '\0') &&
     (iVar3 = __cxa_guard_acquire(&testComparsion(std::__cxx11::string_const&)::localhost),
     iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"localhost",&local_71);
    IpV4::IpV4((IpV4 *)&testComparsion(std::__cxx11::string_const&)::localhost,local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    __cxa_guard_release(&testComparsion(std::__cxx11::string_const&)::localhost);
  }
  if ((testComparsion(std::__cxx11::string_const&)::lower == '\0') &&
     (iVar3 = __cxa_guard_acquire(&testComparsion(std::__cxx11::string_const&)::lower), iVar3 != 0))
  {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"192.167.0.1",&local_99);
    IpV4::IpV4((IpV4 *)&testComparsion(std::__cxx11::string_const&)::lower,local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    __cxa_guard_release(&testComparsion(std::__cxx11::string_const&)::lower);
  }
  if ((testComparsion(std::__cxx11::string_const&)::higher == '\0') &&
     (iVar3 = __cxa_guard_acquire(&testComparsion(std::__cxx11::string_const&)::higher), iVar3 != 0)
     ) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"193.0.0.0",&local_c1);
    IpV4::IpV4((IpV4 *)&testComparsion(std::__cxx11::string_const&)::higher,local_c0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    __cxa_guard_release(&testComparsion(std::__cxx11::string_const&)::higher);
  }
  local_c8 = 0xc0a80001;
  fructose::test_root::get_test_name_abi_cxx11_(&local_e8);
  fructose::test_root::test_assert_eq<unsigned_int,unsigned_int>
            ((test_root *)this,&local_c8,&testComparsion(std::__cxx11::string_const&)::testee,
             (string *)&local_e8,"0xC0A80001","testee.value",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd0);
  std::__cxx11::string::~string((string *)&local_e8);
  local_ec = 0x7f000001;
  fructose::test_root::get_test_name_abi_cxx11_(&local_110);
  fructose::test_root::test_assert_eq<unsigned_int,unsigned_int>
            ((test_root *)this,&local_ec,&testComparsion(std::__cxx11::string_const&)::localhost,
             (string *)&local_110,"0x7F000001U","localhost.value",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd1);
  std::__cxx11::string::~string((string *)&local_110);
  local_114 = 0xc0a70001;
  fructose::test_root::get_test_name_abi_cxx11_(&local_138);
  fructose::test_root::test_assert_eq<unsigned_int,unsigned_int>
            ((test_root *)this,&local_114,&testComparsion(std::__cxx11::string_const&)::lower,
             (string *)&local_138,"0xC0A70001","lower.value",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd2);
  std::__cxx11::string::~string((string *)&local_138);
  local_13c = 0xc1000000;
  fructose::test_root::get_test_name_abi_cxx11_(&local_160);
  fructose::test_root::test_assert_eq<unsigned_int,unsigned_int>
            ((test_root *)this,&local_13c,&testComparsion(std::__cxx11::string_const&)::higher,
             (string *)&local_160,"0xC1000000","higher.value",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd3);
  std::__cxx11::string::~string((string *)&local_160);
  fructose::test_root::set_assertion_tested((test_root *)this);
  std::__cxx11::string::string(local_180);
  local_181 = 0;
  local_182 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"192.168.0.",(allocator *)((long)&anon_var_0 + 7));
  IpV4::IpV4(local_188,local_1a8);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
  if ((local_181 & 1) == 0) {
    if ((local_182 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "expected an exception to be thrown but catchall caught nothing");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"exception caught but not of expected type");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      lVar5 = std::__cxx11::string::length();
      if (lVar5 != 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,local_180);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  bVar1 = local_181;
  fructose::test_root::get_test_name_abi_cxx11_(local_378);
  fructose::test_root::test_assert
            ((test_root *)this,(bool)(bVar1 & 1),(string *)local_378,
             "IpV4 {\"192.168.0.\"} throws std::runtime_error",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd4);
  std::__cxx11::string::~string((string *)local_378);
  std::__cxx11::string::~string(local_180);
  fructose::test_root::set_assertion_tested((test_root *)this);
  std::__cxx11::string::string(local_398);
  local_399 = 0;
  local_39a = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"0.0.0.257",(allocator *)((long)&anon_var_0_1 + 7));
  IpV4::IpV4(local_3a0,local_3c0);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0_1 + 7));
  if ((local_399 & 1) == 0) {
    if ((local_39a & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "expected an exception to be thrown but catchall caught nothing");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"exception caught but not of expected type");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      lVar5 = std::__cxx11::string::length();
      if (lVar5 != 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,local_398);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  bVar1 = local_399;
  fructose::test_root::get_test_name_abi_cxx11_(local_590);
  fructose::test_root::test_assert
            ((test_root *)this,(bool)(bVar1 & 1),(string *)local_590,
             "IpV4 {\"0.0.0.257\"} throws std::runtime_error",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd5);
  std::__cxx11::string::~string((string *)local_590);
  std::__cxx11::string::~string(local_398);
  fructose::test_root::set_assertion_tested((test_root *)this);
  std::__cxx11::string::string(local_5b0);
  local_5b1 = 0;
  local_5b2 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5d8,"-1.0.0.254",(allocator *)((long)&anon_var_0_2 + 7));
  IpV4::IpV4(local_5b8,local_5d8);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0_2 + 7));
  if ((local_5b1 & 1) == 0) {
    if ((local_5b2 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "expected an exception to be thrown but catchall caught nothing");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"exception caught but not of expected type");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      lVar5 = std::__cxx11::string::length();
      if (lVar5 != 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,local_5b0);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  bVar1 = local_5b1;
  fructose::test_root::get_test_name_abi_cxx11_(local_7a8);
  fructose::test_root::test_assert
            ((test_root *)this,(bool)(bVar1 & 1),(string *)local_7a8,
             "IpV4 {\"-1.0.0.254\"} throws std::runtime_error",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd6);
  std::__cxx11::string::~string((string *)local_7a8);
  std::__cxx11::string::~string(local_5b0);
  fructose::test_root::set_assertion_tested((test_root *)this);
  std::__cxx11::string::string(local_7c8);
  local_7c9 = 0;
  local_7ca = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f0,"192.d.0.254",(allocator *)((long)&anon_var_0_3 + 7));
  IpV4::IpV4(local_7d0,local_7f0);
  std::__cxx11::string::~string(local_7f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0_3 + 7));
  if ((local_7c9 & 1) == 0) {
    if ((local_7ca & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "expected an exception to be thrown but catchall caught nothing");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"exception caught but not of expected type");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      lVar5 = std::__cxx11::string::length();
      if (lVar5 != 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,local_7c8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  bVar1 = local_7c9;
  fructose::test_root::get_test_name_abi_cxx11_(local_9c0);
  fructose::test_root::test_assert
            ((test_root *)this,(bool)(bVar1 & 1),(string *)local_9c0,
             "IpV4 {\"192.d.0.254\"} throws std::runtime_error",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd7);
  std::__cxx11::string::~string((string *)local_9c0);
  std::__cxx11::string::~string(local_7c8);
  bVar2 = (bool)IpV4::operator<((IpV4 *)&testComparsion(std::__cxx11::string_const&)::lower,
                                (IpV4 *)&testComparsion(std::__cxx11::string_const&)::testee);
  fructose::test_root::get_test_name_abi_cxx11_(&local_9e0);
  fructose::test_root::test_assert
            ((test_root *)this,bVar2,(string *)&local_9e0,"lower < testee",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd8);
  std::__cxx11::string::~string((string *)&local_9e0);
  bVar2 = (bool)IpV4::operator<((IpV4 *)&testComparsion(std::__cxx11::string_const&)::testee,
                                (IpV4 *)&testComparsion(std::__cxx11::string_const&)::higher);
  fructose::test_root::get_test_name_abi_cxx11_(&local_a00);
  fructose::test_root::test_assert
            ((test_root *)this,bVar2,(string *)&local_a00,"testee < higher",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd9);
  std::__cxx11::string::~string((string *)&local_a00);
  return;
}

Assistant:

void testComparsion(const std::string&)
    {
        static const IpV4 testee {"192.168.0.1"};
        static const IpV4 localhost {"localhost"};
        static const IpV4 lower {"192.167.0.1"};
        static const IpV4 higher {"193.0.0.0"};

        fructose_assert_eq(0xC0A80001, testee.value);
        fructose_assert_eq(0x7F000001U, localhost.value);
        fructose_assert_eq(0xC0A70001, lower.value);
        fructose_assert_eq(0xC1000000, higher.value);
        fructose_assert_exception(IpV4 {"192.168.0."}, std::runtime_error);     // too short
        fructose_assert_exception(IpV4 {"0.0.0.257"}, std::runtime_error);      // too high
        fructose_assert_exception(IpV4 {"-1.0.0.254"}, std::runtime_error);     // too low
        fructose_assert_exception(IpV4 {"192.d.0.254"}, std::runtime_error);    // invalid
        fructose_assert(lower < testee);
        fructose_assert(testee < higher);
    }